

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O0

void gen_local_scope_parser(void *context,fb_scope_t *scope)

{
  char local_128 [8];
  fb_symbol_text_t scope_name;
  trie_t trie;
  int n;
  fb_output_t *out;
  fb_scope_t *scope_local;
  void *context_local;
  
  trie._44_4_ = 0;
  memset(scope_name + 200,0,0x30);
  __flatcc_fb_copy_scope(scope,local_128);
  register0x00000000 =
       build_local_scope_dict(*(fb_schema_t **)((long)context + 0xd8),scope,(int *)&trie.field_0x2c)
  ;
  if ((register0x00000000 == (dict_entry_t *)0x0) && (0 < (int)trie._44_4_)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
            ,0x4a9,"internal error: could not build dictionary for json parser\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x4a9,"void gen_local_scope_parser(void *, fb_scope_t *)");
  }
  trie.gen_unmatched = (gen_unmatched_f *)0x0;
  trie.ct._0_4_ = 3;
  trie.dict = (dict_entry_t *)gen_scope_match;
  trie.gen_match = gen_scope_unmatched;
  println((fb_output_t *)context,
          "static const char *%s_local_%sjson_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
          ,*(undefined8 *)(*(long *)((long)context + 0xd8) + 0x110),local_128);
  *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + 1;
  *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + 1;
  println((fb_output_t *)context,"int *value_type, uint64_t *value, int *aggregate)");
  if (*(int *)((long)context + 0xf0) == 0) {
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x4b5,"void gen_local_scope_parser(void *, fb_scope_t *)");
  }
  *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + -1;
  if (*(int *)((long)context + 0xf0) != 0) {
    *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + -1;
    println((fb_output_t *)context,"{");
    *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + 1;
    if (trie._44_4_ == 0) {
      println((fb_output_t *)context,"/* Scope has no enum / union types to look up. */");
      println((fb_output_t *)context,"return buf; /* unmatched; */");
      if (*(int *)((long)context + 0xf0) == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x4ba,"void gen_local_scope_parser(void *, fb_scope_t *)");
      }
      *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + -1;
      println((fb_output_t *)context,"}");
    }
    else {
      println((fb_output_t *)context,"const char *unmatched = buf;");
      println((fb_output_t *)context,"const char *mark;");
      println((fb_output_t *)context,"uint64_t w;");
      println((fb_output_t *)context,"");
      println((fb_output_t *)context,"w = flatcc_json_parser_symbol_part(buf, end);");
      gen_trie((fb_output_t *)context,(trie_t *)(scope_name + 200),0,trie._44_4_ + -1,0);
      println((fb_output_t *)context,"return buf;");
      if (*(int *)((long)context + 0xf0) == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x4c3,"void gen_local_scope_parser(void *, fb_scope_t *)");
      }
      *(int *)((long)context + 0xf0) = *(int *)((long)context + 0xf0) + -1;
      println((fb_output_t *)context,"}");
    }
    println((fb_output_t *)context,"");
    clear_dict(stack0xffffffffffffffa8);
    return;
  }
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x4b5,"void gen_local_scope_parser(void *, fb_scope_t *)");
}

Assistant:

static void gen_local_scope_parser(void *context, fb_scope_t *scope)
{
    fb_output_t *out = context;
    int n = 0;
    trie_t trie;
    fb_symbol_text_t scope_name;

    fb_clear(trie);
    fb_copy_scope(scope, scope_name);
    if (((trie.dict = build_local_scope_dict(out->S, scope, &n)) == 0) && n > 0) {
        gen_panic(out, "internal error: could not build dictionary for json parser\n");
        return;
    }
    /* Not used for scopes. */
    trie.ct = 0;
    trie.type = local_scope_trie;
    trie.gen_match = gen_scope_match;
    trie.gen_unmatched = gen_scope_unmatched;
    println(out, "static const char *%s_local_%sjson_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,",
        out->S->basename, scope_name);
    indent(); indent();
    println(out, "int *value_type, uint64_t *value, int *aggregate)");
    unindent(); unindent();
    println(out, "{"); indent();
    if (n == 0) {
        println(out, "/* Scope has no enum / union types to look up. */");
        println(out, "return buf; /* unmatched; */");
        unindent(); println(out, "}");
    } else {
        println(out, "const char *unmatched = buf;");
        println(out, "const char *mark;");
        println(out, "uint64_t w;");
        println(out, "");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, &trie, 0, n - 1, 0);
        println(out, "return buf;");
        unindent(); println(out, "}");
    }
    println(out, "");
    clear_dict(trie.dict);
}